

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

pcut_item_t * pcut_fix_list_get_real_head(pcut_item_t *last)

{
  int iVar1;
  pcut_item_t *ppVar2;
  pcut_extra_t *ppVar3;
  int iVar4;
  
  last->next = (pcut_item_t *)0x0;
  inline_nested_lists(last);
  while (ppVar2 = last->previous, ppVar2 != (pcut_item_t *)0x0) {
    ppVar2->next = last;
    inline_nested_lists(ppVar2);
    last = ppVar2;
  }
  ppVar2 = last;
  if (last->kind != 0) goto LAB_00103689;
  do {
    do {
      ppVar2 = pcut_get_real_next(ppVar2);
LAB_00103689:
      if (ppVar2 == (pcut_item_t *)0x0) {
        iVar4 = 1;
        ppVar2 = last;
        iVar1 = 1;
        if (last->kind != 0) goto LAB_001036c4;
        while( true ) {
          iVar4 = iVar1;
          ppVar2 = pcut_get_real_next(ppVar2);
LAB_001036c4:
          if (ppVar2 == (pcut_item_t *)0x0) break;
          ppVar2->id = iVar4;
          iVar1 = iVar4 + 1;
        }
        return last;
      }
    } while (ppVar2->kind != 5);
    for (ppVar3 = ppVar2->extras; ppVar3->type != 2; ppVar3 = ppVar3 + 1) {
      if (ppVar3->type == 1) {
        ppVar2->kind = 0;
        break;
      }
    }
  } while( true );
}

Assistant:

pcut_item_t *pcut_fix_list_get_real_head(pcut_item_t *last) {
	pcut_item_t *next, *it;

	last->next = NULL;

	inline_nested_lists(last);

	next = last;
	it = last->previous;
	while (it != NULL) {
		it->next = next;
		inline_nested_lists(it);
		next = it;
		it = it->previous;
	}

	detect_skipped_tests(next);

	set_ids(next);

	return next;
}